

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O1

double DamageTypeDefinition::GetMobjDamageFactor(FName *type,DmgFactors *factors)

{
  uint uVar1;
  Node *pNVar2;
  bool bVar3;
  Node *pNVar4;
  DamageTypeDefinition *pDVar5;
  double *pdVar6;
  Node *pNVar7;
  Node *pNVar8;
  Node *pNVar9;
  double dVar10;
  
  uVar1 = type->Index;
  if (factors == (DmgFactors *)0x0) {
    if (uVar1 == 0) {
      return 1.0;
    }
    pNVar4 = GlobalDamageDefinitions.Nodes + (GlobalDamageDefinitions.Size - 1 & uVar1);
    while ((pNVar7 = pNVar4, pNVar7 != (Node *)0x0 && (pNVar7->Next != (Node *)0x1))) {
      pNVar4 = pNVar7->Next;
      if ((pNVar7->Pair).Key.Index == uVar1) {
LAB_0039c376:
        if (pNVar7 == (Node *)0x0) {
          return 1.0;
        }
        return (pNVar7->Pair).Value.DefaultFactor;
      }
    }
    pNVar7 = (Node *)0x0;
    goto LAB_0039c376;
  }
  pNVar2 = (factors->super_TMap<FName,_double,_THashTraits<FName>,_TValueTraits<double>_>).Nodes;
  pNVar9 = pNVar2 + ((factors->super_TMap<FName,_double,_THashTraits<FName>,_TValueTraits<double>_>)
                     .Size - 1 & uVar1);
  do {
    pNVar8 = pNVar9;
    if ((pNVar8 == (Node *)0x0) || (pNVar8->Next == (Node *)0x1)) {
      pNVar8 = (Node *)0x0;
      break;
    }
    pNVar9 = pNVar8->Next;
  } while ((pNVar8->Pair).Key.Index != uVar1);
  if (pNVar8 == (Node *)0x0) {
    dVar10 = 1.0;
  }
  else {
    dVar10 = (pNVar8->Pair).Value;
  }
  if (pNVar8 != (Node *)0x0 || uVar1 == 0) {
    return dVar10;
  }
  do {
    pNVar9 = pNVar2;
    if ((pNVar9 == (Node *)0x0) || (pNVar9->Next == (Node *)0x1)) {
      pNVar9 = (Node *)0x0;
      break;
    }
    pNVar2 = pNVar9->Next;
  } while ((pNVar9->Pair).Key.Index != 0);
  pdVar6 = &(pNVar9->Pair).Value;
  if (pNVar9 == (Node *)0x0) {
    pdVar6 = (double *)0x0;
  }
  pNVar4 = GlobalDamageDefinitions.Nodes + (GlobalDamageDefinitions.Size - 1 & uVar1);
  do {
    pNVar7 = pNVar4;
    if ((pNVar7 == (Node *)0x0) || (pNVar7->Next == (Node *)0x1)) {
      pNVar7 = (Node *)0x0;
      break;
    }
    pNVar4 = pNVar7->Next;
  } while ((pNVar7->Pair).Key.Index != uVar1);
  pDVar5 = &(pNVar7->Pair).Value;
  if (pNVar7 == (Node *)0x0) {
    pDVar5 = (DamageTypeDefinition *)0x0;
  }
  if (pNVar9 == (Node *)0x0) {
    if (pNVar7 == (Node *)0x0) {
      bVar3 = true;
      goto LAB_0039c392;
    }
LAB_0039c386:
    dVar10 = pDVar5->DefaultFactor;
  }
  else if (pNVar7 == (Node *)0x0) {
    dVar10 = *pdVar6;
  }
  else {
    if (pDVar5->ReplaceFactor == true) goto LAB_0039c386;
    dVar10 = *pdVar6 * pDVar5->DefaultFactor;
  }
  bVar3 = false;
LAB_0039c392:
  if (bVar3) {
    dVar10 = 1.0;
  }
  return dVar10;
}

Assistant:

double DamageTypeDefinition::GetMobjDamageFactor(FName type, DmgFactors const * const factors)
{
	if (factors)
	{
		// If the actor has named damage factors, look for a specific factor

		auto pdf = factors->CheckKey(type);
		if (pdf) return *pdf; // type specific damage type
		
		// If this was nonspecific damage, don't fall back to nonspecific search
		if (type == NAME_None) return 1.;
	}
	
	// If this was nonspecific damage, don't fall back to nonspecific search
	else if (type == NAME_None) 
	{ 
		return 1.;
	}
	else
	{
		// Normal is unsupplied / 1.0, so there's no difference between modifying and overriding
		DamageTypeDefinition *dtd = Get(type);
		return dtd ? dtd->DefaultFactor : 1.;
	}
	
	{
		auto pdf  = factors->CheckKey(NAME_None);
		DamageTypeDefinition *dtd = Get(type);
		// Here we are looking for modifications to untyped damage
		// If the calling actor defines untyped damage factor, that is contained in "pdf".
		if (pdf) // normal damage available
		{
			if (dtd)
			{
				if (dtd->ReplaceFactor) return dtd->DefaultFactor; // use default instead of untyped factor
				return *pdf * dtd->DefaultFactor; // use default as modification of untyped factor
			}
			return *pdf; // there was no default, so actor default is used
		}
		else if (dtd)
		{
			return dtd->DefaultFactor; // implicit untyped factor 1.0 does not need to be applied/replaced explicitly
		}
	}
	return 1.;
}